

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

VulkanDynamicAllocation * __thiscall
Diligent::DeviceContextVkImpl::AllocateDynamicSpace
          (VulkanDynamicAllocation *__return_storage_ptr__,DeviceContextVkImpl *this,
          Uint64 SizeInBytes,Uint32 Alignment)

{
  uint uVar1;
  Char *Message;
  Uint64 UVar2;
  undefined1 local_48 [8];
  string msg;
  Uint32 Alignment_local;
  Uint64 SizeInBytes_local;
  DeviceContextVkImpl *this_local;
  VulkanDynamicAllocation *DynAlloc;
  
  msg.field_2._12_4_ = Alignment;
  uVar1 = std::numeric_limits<unsigned_int>::max();
  if (uVar1 <= SizeInBytes) {
    FormatString<char[47]>
              ((string *)local_48,(char (*) [47])"Dynamic allocation size must be less than 2^32");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AllocateDynamicSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd17);
    std::__cxx11::string::~string((string *)local_48);
  }
  VulkanDynamicHeap::Allocate
            (__return_storage_ptr__,&this->m_DynamicHeap,(Uint32)SizeInBytes,msg.field_2._12_4_);
  UVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::GetFrameNumber
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  __return_storage_ptr__->dvpFrameNumber = UVar2;
  return __return_storage_ptr__;
}

Assistant:

VulkanDynamicAllocation DeviceContextVkImpl::AllocateDynamicSpace(Uint64 SizeInBytes, Uint32 Alignment)
{
    DEV_CHECK_ERR(SizeInBytes < std::numeric_limits<Uint32>::max(),
                  "Dynamic allocation size must be less than 2^32");

    VulkanDynamicAllocation DynAlloc = m_DynamicHeap.Allocate(static_cast<Uint32>(SizeInBytes), Alignment);
#ifdef DILIGENT_DEVELOPMENT
    DynAlloc.dvpFrameNumber = GetFrameNumber();
#endif
    return DynAlloc;
}